

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O0

int mp_read_int32(char **data,int32_t *ret)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  bool local_4a;
  char *pcStack_38;
  uint8_t c;
  char *p;
  uint64_t uval;
  int64_t ival;
  int32_t *ret_local;
  char **data_local;
  
  pcStack_38 = *data;
  ival = (int64_t)ret;
  ret_local = (int32_t *)data;
  bVar1 = mp_load_u8(&stack0xffffffffffffffc8);
  uVar2 = bVar1 - 0xcc;
  if (uVar2 < 7 || bVar1 == 0xd3) {
    iVar3 = (*(code *)(&DAT_00156820 + *(int *)(&DAT_00156820 + (ulong)uVar2 * 4)))();
    return iVar3;
  }
  local_4a = (char)bVar1 < -0x20;
  if (local_4a) {
    data_local._4_4_ = -1;
  }
  else {
    *(int *)ival = (int)(char)bVar1;
    *(char **)ret_local = pcStack_38;
    data_local._4_4_ = 0;
  }
  return data_local._4_4_;
}

Assistant:

MP_IMPL int
mp_read_int32(const char **data, int32_t *ret)
{
	int64_t ival;
	uint64_t uval;
	const char *p = *data;
	uint8_t c = mp_load_u8(&p);
	switch (c) {
	case 0xd0:
		*ret = (int8_t)mp_load_u8(&p);
		goto commit;
	case 0xd1:
		*ret = (int16_t)mp_load_u16(&p);
		goto commit;
	case 0xd2:
		*ret = (int32_t)mp_load_u32(&p);
		goto commit;
	case 0xd3:
		ival = (int64_t)mp_load_u64(&p);
		if (mp_unlikely(ival > INT32_MAX || ival < INT32_MIN))
			return -1;
		*ret = (int32_t)ival;
		goto commit;
	case 0xcc:
		*ret = (int32_t)mp_load_u8(&p);
		goto commit;
	case 0xcd:
		*ret = (int32_t)mp_load_u16(&p);
		goto commit;
	case 0xce:
		uval = mp_load_u32(&p);
		goto handle_unsigned;
	case 0xcf:
		uval = mp_load_u64(&p);
		goto handle_unsigned;
	default:
		if (mp_unlikely(c < 0xe0 && c > 0x7f))
			return -1;
		*ret = (int8_t) c;
		goto commit;
	}
handle_unsigned:
	if (mp_unlikely(uval > INT32_MAX))
		return -1;
	*ret = (int32_t)uval;
	goto commit;
commit:
	*data = p;
	return 0;
}